

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O3

void testTiledRgba(string *tempDir)

{
  undefined8 *puVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  pointer pcVar5;
  Compression comp;
  _Alloc_hider _Var6;
  byte bVar7;
  char cVar8;
  int iVar9;
  Compression CVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long *plVar14;
  ostream *this;
  void *pvVar15;
  undefined4 *puVar16;
  void *pvVar17;
  void *pvVar18;
  int *piVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  int y;
  long lVar23;
  long lVar24;
  long lVar25;
  int tileX;
  long lVar26;
  int tileY;
  int iVar27;
  int i;
  long lVar28;
  bool bVar29;
  string fileName;
  char *local_c8;
  Header header;
  string fileName_1;
  TiledRgbaOutputFile out;
  half hStack_5e;
  half hStack_5c;
  half hStack_5a;
  undefined4 local_58 [2];
  undefined8 local_50;
  undefined4 *local_48;
  undefined4 *local_40;
  undefined8 local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing the tiled RGBA image interface",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  bVar7 = IlmThread_3_4::supportsThreads();
  uVar13 = 0;
  while( true ) {
    cVar8 = IlmThread_3_4::supportsThreads();
    if (cVar8 != '\0') {
      Imf_3_4::setGlobalThreadCount(uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nnumber of threads: ",0x14);
      iVar9 = Imf_3_4::globalThreadCount();
      plVar14 = (long *)std::ostream::operator<<(&std::cout,iVar9);
      std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
      std::ostream::put((char)plVar14);
      std::ostream::flush();
    }
    lVar28 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nImage size = ",0xe);
      iVar9 = (&DAT_001c8350)[lVar28];
      this = (ostream *)std::ostream::operator<<(&std::cout,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>(this," x ",3);
      iVar27 = (&DAT_001c8360)[lVar28];
      plVar14 = (long *)std::ostream::operator<<(this,iVar27);
      std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
      std::ostream::put((char)plVar14);
      std::ostream::flush();
      CVar10 = NO_COMPRESSION;
      do {
        comp = CVar10;
        if (CVar10 == ZIP_COMPRESSION) {
          comp = PIZ_COMPRESSION;
        }
        if (lVar28 == 0) {
          anon_unknown.dwarf_33d582::writeRead
                    ((anon_unknown_dwarf_33d582 *)(tempDir->_M_dataplus)._M_p,
                     (string *)tempDir->_M_string_length,iVar9,iVar27,comp,1,1);
        }
        anon_unknown.dwarf_33d582::writeRead
                  ((anon_unknown_dwarf_33d582 *)(tempDir->_M_dataplus)._M_p,
                   (string *)tempDir->_M_string_length,iVar9,iVar27,comp,0x23,0x1a);
        anon_unknown.dwarf_33d582::writeRead
                  ((anon_unknown_dwarf_33d582 *)(tempDir->_M_dataplus)._M_p,
                   (string *)tempDir->_M_string_length,iVar9,iVar27,comp,0x4b,0x34);
        anon_unknown.dwarf_33d582::writeRead
                  ((anon_unknown_dwarf_33d582 *)(tempDir->_M_dataplus)._M_p,
                   (string *)tempDir->_M_string_length,iVar9,iVar27,comp,0x108,0x81);
        CVar10 = comp + RLE_COMPRESSION;
      } while ((int)comp < 9);
      lVar28 = lVar28 + 1;
    } while (lVar28 != 4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nfile with missing and broken tiles",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
    pcVar5 = (tempDir->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fileName,pcVar5,pcVar5 + tempDir->_M_string_length);
    std::__cxx11::string::append((char *)&fileName);
    pvVar15 = operator_new__(960000);
    testTiledRgba();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    remove(fileName._M_dataplus._M_p);
    _out = 0;
    hStack_5e._h = 0;
    hStack_5c._h = 0;
    hStack_5a._h = 0;
    Imf_3_4::Header::Header(&header,400,300,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
    puVar16 = (undefined4 *)Imf_3_4::Header::lineOrder();
    _Var6 = fileName._M_dataplus;
    *puVar16 = 2;
    iVar9 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
              (&out,_Var6._M_p,&header,WRITE_RGBA,0x1e,0x28,ONE_LEVEL,ROUND_DOWN,iVar9);
    Imf_3_4::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pvVar15,1);
    iVar9 = (int)(Rgba *)&out;
    Imf_3_4::TiledRgbaOutputFile::writeTile(iVar9,0,0);
    for (iVar27 = 0; iVar11 = Imf_3_4::TiledRgbaOutputFile::numYTiles(iVar9), iVar27 < iVar11;
        iVar27 = iVar27 + 1) {
      for (iVar11 = 0; iVar12 = Imf_3_4::TiledRgbaOutputFile::numXTiles(iVar9), iVar11 < iVar12;
          iVar11 = iVar11 + 1) {
        if ((iVar27 + iVar11 & 1U) != 0) {
          Imf_3_4::TiledRgbaOutputFile::writeTile(iVar9,iVar11,iVar27);
        }
      }
    }
    Imf_3_4::TiledRgbaOutputFile::writeTile(iVar9,2,0);
    Imf_3_4::TiledRgbaOutputFile::breakTile(iVar9,0,0,0,0,0x19,'\n');
    Imf_3_4::TiledRgbaOutputFile::breakTile(iVar9,2,0,0,0,0x19,'\n');
    Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
    Imf_3_4::Header::~Header(&header);
    pvVar17 = operator_new__(960000);
    lVar28 = 0;
    pvVar18 = pvVar17;
    do {
      lVar23 = 0;
      do {
        puVar1 = (undefined8 *)((long)pvVar18 + lVar23 * 8);
        *puVar1 = 0xbc00bc00bc00bc00;
        puVar1[1] = 0xbc00bc00bc00bc00;
        lVar23 = lVar23 + 2;
      } while (lVar23 != 400);
      lVar28 = lVar28 + 1;
      pvVar18 = (void *)((long)pvVar18 + 0xc80);
    } while (lVar28 != 300);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"reading one tile at a time,",0x1b);
    std::ostream::flush();
    _Var6 = fileName._M_dataplus;
    iVar9 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&header,_Var6._M_p,iVar9);
    piVar19 = (int *)Imf_3_4::TiledRgbaInputFile::dataWindow();
    if (piVar19[2] - *piVar19 != 399) {
      __assert_fail("dw.max.x - dw.min.x + 1 == width",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x217,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (piVar19[3] - piVar19[1] != 299) {
      __assert_fail("dw.max.y - dw.min.y + 1 == height",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x218,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (*piVar19 != 0) {
      __assert_fail("dw.min.x == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x219,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (piVar19[1] != 0) {
      __assert_fail("dw.min.y == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x21a,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    Imf_3_4::TiledRgbaInputFile::setFrameBuffer((Rgba *)&header,(ulong)pvVar17,1);
    iVar9 = 0;
    while( true ) {
      iVar11 = (int)(Rgba *)&header;
      iVar27 = Imf_3_4::TiledRgbaInputFile::numYTiles(iVar11);
      if (iVar27 <= iVar9) break;
      for (iVar27 = 0; iVar12 = Imf_3_4::TiledRgbaInputFile::numXTiles(iVar11), iVar27 < iVar12;
          iVar27 = iVar27 + 1) {
        Imf_3_4::TiledRgbaInputFile::readTile(iVar11,iVar27,iVar9);
        if ((iVar9 + iVar27 & 1U) != 1) {
          __assert_fail("tileBroken || (tilePresent == ((tileX + tileY) & 1))",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                        ,0x232,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
      }
      iVar9 = iVar9 + 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::ostream::flush();
    lVar23 = (long)pvVar17 + 6;
    lVar26 = (long)pvVar15 + 6;
    lVar24 = 0;
    lVar28 = lVar26;
    do {
      lVar25 = 0;
      do {
        fVar3 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(lVar23 + -6 + lVar25 * 8) * 4);
        if ((((uint)lVar25 & 0xffff) / 0x1e + ((uint)lVar24 & 0xffff) / 0x28 & 1) == 0) {
          if ((((fVar3 != -1.0) || (NAN(fVar3))) ||
              (fVar3 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar23 + -4 + lVar25 * 8) * 4), fVar3 != -1.0))
             || (((NAN(fVar3) ||
                  (fVar3 = *(float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar23 + -2 + lVar25 * 8) * 4),
                  fVar3 != -1.0)) ||
                 ((NAN(fVar3) ||
                  ((fVar3 = *(float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)(lVar23 + lVar25 * 8) * 4), fVar3 != -1.0 ||
                   (NAN(fVar3))))))))) {
            __assert_fail("t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x24a,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
        }
        else {
          pfVar2 = (float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + -6 + lVar25 * 8) * 4);
          if (((((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) ||
               (fVar3 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar23 + -4 + lVar25 * 8) * 4),
               pfVar2 = (float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar28 + -4 + lVar25 * 8) * 4), fVar3 != *pfVar2
               )) || ((NAN(fVar3) || NAN(*pfVar2) ||
                      (fVar3 = *(float *)(_imath_half_to_float_table +
                                         (ulong)*(ushort *)(lVar23 + -2 + lVar25 * 8) * 4),
                      pfVar2 = (float *)(_imath_half_to_float_table +
                                        (ulong)*(ushort *)(lVar28 + -2 + lVar25 * 8) * 4),
                      fVar3 != *pfVar2)))) ||
             ((NAN(fVar3) || NAN(*pfVar2) ||
              ((fVar3 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar23 + lVar25 * 8) * 4),
               pfVar2 = (float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar28 + lVar25 * 8) * 4), fVar3 != *pfVar2 ||
               (NAN(fVar3) || NAN(*pfVar2))))))) {
            __assert_fail("t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x246,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != 400);
      lVar24 = lVar24 + 1;
      lVar23 = lVar23 + 0xc80;
      lVar28 = lVar28 + 0xc80;
    } while (lVar24 != 300);
    Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
    operator_delete__(pvVar17);
    pvVar17 = operator_new__(960000);
    lVar28 = 0;
    pvVar18 = pvVar17;
    do {
      lVar23 = 0;
      do {
        puVar1 = (undefined8 *)((long)pvVar18 + lVar23 * 8);
        *puVar1 = 0xbc00bc00bc00bc00;
        puVar1[1] = 0xbc00bc00bc00bc00;
        lVar23 = lVar23 + 2;
      } while (lVar23 != 400);
      lVar28 = lVar28 + 1;
      pvVar18 = (void *)((long)pvVar18 + 0xc80);
    } while (lVar28 != 300);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"reading multiple tiles at a time,",0x21);
    std::ostream::flush();
    _Var6 = fileName._M_dataplus;
    iVar9 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&header,_Var6._M_p,iVar9);
    piVar19 = (int *)Imf_3_4::TiledRgbaInputFile::dataWindow();
    if (piVar19[2] - *piVar19 != 399) {
      __assert_fail("dw.max.x - dw.min.x + 1 == width",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x25c,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (piVar19[3] - piVar19[1] != 299) {
      __assert_fail("dw.max.y - dw.min.y + 1 == height",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x25d,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (*piVar19 != 0) {
      __assert_fail("dw.min.x == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x25e,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (piVar19[1] != 0) {
      __assert_fail("dw.min.y == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x25f,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    Imf_3_4::TiledRgbaInputFile::setFrameBuffer((Rgba *)&header,(ulong)pvVar17,1);
    iVar9 = Imf_3_4::TiledRgbaInputFile::numYTiles(iVar11);
    if (0 < iVar9) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::ostream::flush();
    lVar28 = (long)pvVar17 + 6;
    lVar23 = 0;
    do {
      lVar24 = 0;
      do {
        fVar3 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(lVar28 + -6 + lVar24 * 8) * 4);
        if (((((fVar3 != -1.0) || (NAN(fVar3))) ||
             (fVar4 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar28 + -4 + lVar24 * 8) * 4), fVar4 != -1.0))
            || (((NAN(fVar4) ||
                 (fVar4 = *(float *)(_imath_half_to_float_table +
                                    (ulong)*(ushort *)(lVar28 + -2 + lVar24 * 8) * 4), fVar4 != -1.0
                 )) || ((NAN(fVar4) ||
                        ((fVar4 = *(float *)(_imath_half_to_float_table +
                                            (ulong)*(ushort *)(lVar28 + lVar24 * 8) * 4),
                         fVar4 != -1.0 || (NAN(fVar4))))))))) &&
           (((pfVar2 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar26 + -6 + lVar24 * 8) * 4), fVar3 != *pfVar2
             || ((((NAN(fVar3) || NAN(*pfVar2) ||
                   (fVar3 = *(float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)(lVar28 + -4 + lVar24 * 8) * 4),
                   pfVar2 = (float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar26 + -4 + lVar24 * 8) * 4),
                   fVar3 != *pfVar2)) || (NAN(fVar3) || NAN(*pfVar2))) ||
                 ((fVar3 = *(float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar28 + -2 + lVar24 * 8) * 4),
                  pfVar2 = (float *)(_imath_half_to_float_table +
                                    (ulong)*(ushort *)(lVar26 + -2 + lVar24 * 8) * 4),
                  fVar3 != *pfVar2 || (NAN(fVar3) || NAN(*pfVar2))))))) ||
            ((fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar28 + lVar24 * 8) * 4),
             pfVar2 = (float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar26 + lVar24 * 8) * 4), fVar3 != *pfVar2 ||
             (NAN(fVar3) || NAN(*pfVar2))))))) {
          __assert_fail("(t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1) || (t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                        ,0x283,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 != 400);
      lVar23 = lVar23 + 1;
      lVar28 = lVar28 + 0xc80;
      lVar26 = lVar26 + 0xc80;
    } while (lVar23 != 300);
    Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
    operator_delete__(pvVar17);
    remove(fileName._M_dataplus._M_p);
    operator_delete__(pvVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileName._M_dataplus._M_p != &fileName.field_2) {
      operator_delete(fileName._M_dataplus._M_p,
                      CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                               fileName.field_2._M_allocated_capacity._0_4_) + 1);
    }
    bVar29 = uVar13 < 3;
    uVar13 = uVar13 + 1;
    if ((bVar7 & bVar29) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nreading multi-layer file",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      fileName_1._M_dataplus._M_p = (pointer)&fileName_1.field_2;
      pcVar5 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&fileName_1,pcVar5,pcVar5 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&fileName_1);
      pcVar20 = (char *)operator_new__(0xdc56);
      pcVar21 = (char *)operator_new__(0xdc56);
      testTiledRgba();
      fileName._M_dataplus._M_p = (pointer)0x0;
      Imf_3_4::Header::Header
                (&header,0xed,0x77,1.0,(Vec2 *)&fileName,1.0,INCREASING_Y,ZIP_COMPRESSION);
      fileName._M_dataplus._M_p = (pointer)0x2000000020;
      fileName._M_string_length = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&header);
      pcVar22 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar22,(Channel *)0x1b882b);
      pcVar22 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar22,(Channel *)"foo.R");
      local_48 = local_58;
      local_58[0] = 0;
      local_50 = 0;
      local_38 = 0;
      local_40 = local_48;
      Imf_3_4::Slice::Slice((Slice *)&fileName,HALF,pcVar20,2,0x1da,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1b882b);
      Imf_3_4::Slice::Slice((Slice *)&fileName,HALF,pcVar21,2,0x1da,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)"foo.R");
      _Var6 = fileName_1._M_dataplus;
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile
                ((TiledOutputFile *)&fileName,_Var6._M_p,&header,iVar9);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&fileName);
      iVar11 = (int)&fileName;
      iVar9 = Imf_3_4::TiledOutputFile::numXTiles(iVar11);
      iVar27 = Imf_3_4::TiledOutputFile::numYTiles(iVar11);
      Imf_3_4::TiledOutputFile::writeTiles(iVar11,0,iVar9 + -1,0,iVar27 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fileName);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      Imf_3_4::Header::~Header(&header);
      _Var6 = fileName_1._M_dataplus;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      fileName._M_string_length = 0;
      fileName.field_2._M_allocated_capacity._0_4_ =
           fileName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&header,_Var6._M_p,(string *)&fileName,iVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      pvVar15 = operator_new__(0x37158);
      Imf_3_4::TiledRgbaInputFile::setFrameBuffer((Rgba *)&header,(ulong)pvVar15,1);
      iVar9 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
      iVar27 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
      Imf_3_4::TiledRgbaInputFile::readTiles((int)&header,0,iVar9 + -1,0,iVar27 + -1);
      lVar28 = (long)pvVar15 + 6;
      lVar23 = 0;
      pcVar22 = pcVar20;
      do {
        lVar24 = 0;
        do {
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + -6 + lVar24 * 8) * 4);
          pfVar2 = (float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(pcVar22 + lVar24 * 2) * 4);
          if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
            __assert_fail("p3[y][x].r == p1[y][x]",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2c9,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + -4 + lVar24 * 8) * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            __assert_fail("p3[y][x].g == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2ca,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + -2 + lVar24 * 8) * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            __assert_fail("p3[y][x].b == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2cb,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + lVar24 * 8) * 4);
          if ((fVar3 != 1.0) || (NAN(fVar3))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2cc,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 != 0xed);
        lVar23 = lVar23 + 1;
        lVar28 = lVar28 + 0x768;
        pcVar22 = pcVar22 + 0x1da;
      } while (lVar23 != 0x77);
      operator_delete__(pvVar15);
      Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
      _Var6 = fileName_1._M_dataplus;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      fileName.field_2._M_allocated_capacity._0_4_ = 0x6f6f66;
      fileName._M_string_length = 3;
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&header,_Var6._M_p,(string *)&fileName,iVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      pvVar15 = operator_new__(0x37158);
      Imf_3_4::TiledRgbaInputFile::setFrameBuffer((Rgba *)&header,(ulong)pvVar15,1);
      iVar9 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
      iVar27 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
      Imf_3_4::TiledRgbaInputFile::readTiles((int)&header,0,iVar9 + -1,0,iVar27 + -1);
      lVar28 = (long)pvVar15 + 6;
      lVar23 = 0;
      pcVar22 = pcVar21;
      do {
        lVar24 = 0;
        do {
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + -6 + lVar24 * 8) * 4);
          pfVar2 = (float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(pcVar22 + lVar24 * 2) * 4);
          if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
            __assert_fail("p3[y][x].r == p2[y][x]",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2dc,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + -4 + lVar24 * 8) * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            __assert_fail("p3[y][x].g == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2dd,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + -2 + lVar24 * 8) * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            __assert_fail("p3[y][x].b == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2de,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + lVar24 * 8) * 4);
          if ((fVar3 != 1.0) || (NAN(fVar3))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2df,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 != 0xed);
        lVar23 = lVar23 + 1;
        lVar28 = lVar28 + 0x768;
        pcVar22 = pcVar22 + 0x1da;
      } while (lVar23 != 0x77);
      operator_delete__(pvVar15);
      Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
      _Var6 = fileName_1._M_dataplus;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      fileName._M_string_length = 0;
      fileName.field_2._M_allocated_capacity._0_4_ =
           fileName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&header,_Var6._M_p,(string *)&fileName,iVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      pvVar15 = operator_new__(0x37158);
      Imf_3_4::TiledRgbaInputFile::setFrameBuffer((Rgba *)&header,(ulong)pvVar15,1);
      iVar9 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
      iVar27 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
      Imf_3_4::TiledRgbaInputFile::readTiles((int)&header,0,iVar9 + -1,0,iVar27 / 2 + -1);
      fileName.field_2._M_allocated_capacity._0_4_ = 0x6f6f66;
      fileName._M_string_length = 3;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      Imf_3_4::TiledRgbaInputFile::setLayerName((string *)&header);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      Imf_3_4::TiledRgbaInputFile::setFrameBuffer((Rgba *)&header,(ulong)pvVar15,1);
      iVar9 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
      iVar27 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
      iVar12 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
      Imf_3_4::TiledRgbaInputFile::readTiles((int)&header,0,iVar9 + -1,iVar27 / 2,iVar12 + -1);
      lVar28 = (long)pvVar15 + 6;
      lVar23 = 0;
      pcVar22 = pcVar20;
      local_c8 = pcVar21;
      do {
        lVar24 = 0;
        do {
          iVar9 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
          iVar27 = Imf_3_4::TiledRgbaInputFile::tileYSize();
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + -6 + lVar24 * 8) * 4);
          if (lVar23 < iVar27 * (iVar9 / 2)) {
            pfVar2 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pcVar22 + lVar24 * 2) * 4);
            if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
              __assert_fail("p3[y][x].r == p1[y][x]",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                            ,0x2fa,
                            "void (anonymous namespace)::writeReadLayers(const std::string &)");
            }
          }
          else {
            pfVar2 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(local_c8 + lVar24 * 2) * 4);
            if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
              __assert_fail("p3[y][x].r == p2[y][x]",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                            ,0x2fc,
                            "void (anonymous namespace)::writeReadLayers(const std::string &)");
            }
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + -4 + lVar24 * 8) * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            __assert_fail("p3[y][x].g == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2fe,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + -2 + lVar24 * 8) * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            __assert_fail("p3[y][x].b == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2ff,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + lVar24 * 8) * 4);
          if ((fVar3 != 1.0) || (NAN(fVar3))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x300,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 != 0xed);
        lVar23 = lVar23 + 1;
        pcVar22 = pcVar22 + 0x1da;
        lVar28 = lVar28 + 0x768;
        local_c8 = local_c8 + 0x1da;
      } while (lVar23 != 0x77);
      operator_delete__(pvVar15);
      Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
      fileName._M_dataplus._M_p = (pointer)0x0;
      Imf_3_4::Header::Header
                (&header,0xed,0x77,1.0,(Vec2 *)&fileName,1.0,INCREASING_Y,ZIP_COMPRESSION);
      fileName._M_dataplus._M_p = (pointer)0x2000000020;
      fileName._M_string_length = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&header);
      pcVar22 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar22,(Channel *)0x1c40a5);
      pcVar22 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar22,(Channel *)"foo.Y");
      local_58[0] = 0;
      local_50 = 0;
      local_38 = 0;
      local_48 = local_58;
      local_40 = local_58;
      Imf_3_4::Slice::Slice((Slice *)&fileName,HALF,pcVar20,2,0x1da,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c40a5);
      Imf_3_4::Slice::Slice((Slice *)&fileName,HALF,pcVar21,2,0x1da,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)"foo.Y");
      _Var6 = fileName_1._M_dataplus;
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile
                ((TiledOutputFile *)&fileName,_Var6._M_p,&header,iVar9);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&fileName);
      iVar9 = Imf_3_4::TiledOutputFile::numXTiles(iVar11);
      iVar27 = Imf_3_4::TiledOutputFile::numYTiles(iVar11);
      Imf_3_4::TiledOutputFile::writeTiles(iVar11,0,iVar9 + -1,0,iVar27 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fileName);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      Imf_3_4::Header::~Header(&header);
      _Var6 = fileName_1._M_dataplus;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      fileName._M_string_length = 0;
      fileName.field_2._M_allocated_capacity._0_4_ =
           fileName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&header,_Var6._M_p,(string *)&fileName,iVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      pvVar15 = operator_new__(0x37158);
      Imf_3_4::TiledRgbaInputFile::setFrameBuffer((Rgba *)&header,(ulong)pvVar15,1);
      iVar9 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
      iVar27 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
      Imf_3_4::TiledRgbaInputFile::readTiles((int)&header,0,iVar9 + -1,0,iVar27 + -1);
      lVar28 = (long)pvVar15 + 6;
      lVar23 = 0;
      pcVar22 = pcVar20;
      do {
        lVar24 = 0;
        do {
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + -6 + lVar24 * 8) * 4);
          fVar4 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(pcVar22 + lVar24 * 2) * 4);
          if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
            __assert_fail("p3[y][x].r == p1[y][x]",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x32d,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + -4 + lVar24 * 8) * 4);
          if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
            __assert_fail("p3[y][x].g == p1[y][x]",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x32e,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + -2 + lVar24 * 8) * 4);
          if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
            __assert_fail("p3[y][x].b == p1[y][x]",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x32f,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + lVar24 * 8) * 4);
          if ((fVar3 != 1.0) || (NAN(fVar3))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x330,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 != 0xed);
        lVar23 = lVar23 + 1;
        lVar28 = lVar28 + 0x768;
        pcVar22 = pcVar22 + 0x1da;
      } while (lVar23 != 0x77);
      operator_delete__(pvVar15);
      Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
      _Var6 = fileName_1._M_dataplus;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      fileName.field_2._M_allocated_capacity._0_4_ = 0x6f6f66;
      fileName._M_string_length = 3;
      iVar9 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&header,_Var6._M_p,(string *)&fileName,iVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      pvVar15 = operator_new__(0x37158);
      Imf_3_4::TiledRgbaInputFile::setFrameBuffer((Rgba *)&header,(ulong)pvVar15,1);
      iVar9 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
      iVar27 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
      Imf_3_4::TiledRgbaInputFile::readTiles((int)&header,0,iVar9 + -1,0,iVar27 + -1);
      lVar28 = (long)pvVar15 + 6;
      lVar23 = 0;
      pcVar22 = pcVar21;
      do {
        lVar24 = 0;
        do {
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + -6 + lVar24 * 8) * 4);
          fVar4 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(pcVar22 + lVar24 * 2) * 4);
          if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
            __assert_fail("p3[y][x].r == p2[y][x]",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x340,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + -4 + lVar24 * 8) * 4);
          if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
            __assert_fail("p3[y][x].g == p2[y][x]",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x341,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + -2 + lVar24 * 8) * 4);
          if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
            __assert_fail("p3[y][x].b == p2[y][x]",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x342,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar28 + lVar24 * 8) * 4);
          if ((fVar3 != 1.0) || (NAN(fVar3))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x343,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 != 0xed);
        lVar23 = lVar23 + 1;
        lVar28 = lVar28 + 0x768;
        pcVar22 = pcVar22 + 0x1da;
        if (lVar23 == 0x77) {
          operator_delete__(pvVar15);
          Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
          _Var6 = fileName_1._M_dataplus;
          fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
          fileName._M_string_length = 0;
          fileName.field_2._M_allocated_capacity._0_4_ =
               fileName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
          iVar9 = Imf_3_4::globalThreadCount();
          Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
                    ((TiledRgbaInputFile *)&header,_Var6._M_p,(string *)&fileName,iVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fileName._M_dataplus._M_p != &fileName.field_2) {
            operator_delete(fileName._M_dataplus._M_p,
                            CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                     fileName.field_2._M_allocated_capacity._0_4_) + 1);
          }
          pvVar15 = operator_new__(0x37158);
          Imf_3_4::TiledRgbaInputFile::setFrameBuffer((Rgba *)&header,(ulong)pvVar15,1);
          iVar9 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
          iVar27 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
          Imf_3_4::TiledRgbaInputFile::readTiles((int)&header,0,iVar9 + -1,0,iVar27 / 2 + -1);
          fileName.field_2._M_allocated_capacity._0_4_ = 0x6f6f66;
          fileName._M_string_length = 3;
          fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
          Imf_3_4::TiledRgbaInputFile::setLayerName((string *)&header);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fileName._M_dataplus._M_p != &fileName.field_2) {
            operator_delete(fileName._M_dataplus._M_p,
                            CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                     fileName.field_2._M_allocated_capacity._0_4_) + 1);
          }
          Imf_3_4::TiledRgbaInputFile::setFrameBuffer((Rgba *)&header,(ulong)pvVar15,1);
          iVar9 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
          iVar27 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
          iVar11 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
          Imf_3_4::TiledRgbaInputFile::readTiles((int)&header,0,iVar9 + -1,iVar27 / 2,iVar11 + -1);
          lVar23 = (long)pvVar15 + 6;
          lVar28 = 0;
          pcVar22 = pcVar20;
          local_c8 = pcVar21;
          do {
            lVar24 = 0;
            do {
              iVar9 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
              iVar27 = Imf_3_4::TiledRgbaInputFile::tileYSize();
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + -6 + lVar24 * 8) * 4);
              if (lVar28 < iVar27 * (iVar9 / 2)) {
                fVar4 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(pcVar22 + lVar24 * 2) * 4);
                if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
                  __assert_fail("p3[y][x].r == p1[y][x]",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                ,0x35f,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
                fVar3 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar23 + -4 + lVar24 * 8) * 4);
                if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
                  __assert_fail("p3[y][x].g == p1[y][x]",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                ,0x360,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
                fVar3 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar23 + -2 + lVar24 * 8) * 4);
                if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
                  __assert_fail("p3[y][x].b == p1[y][x]",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                ,0x361,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
              }
              else {
                fVar4 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(local_c8 + lVar24 * 2) * 4);
                if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
                  __assert_fail("p3[y][x].r == p2[y][x]",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                ,0x365,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
                fVar3 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar23 + -4 + lVar24 * 8) * 4);
                if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
                  __assert_fail("p3[y][x].g == p2[y][x]",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                ,0x366,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
                fVar3 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar23 + -2 + lVar24 * 8) * 4);
                if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
                  __assert_fail("p3[y][x].b == p2[y][x]",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                ,0x367,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
              }
              fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar23 + lVar24 * 8) * 4);
              if ((fVar3 != 1.0) || (NAN(fVar3))) {
                __assert_fail("p3[y][x].a == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x36a,
                              "void (anonymous namespace)::writeReadLayers(const std::string &)");
              }
              lVar24 = lVar24 + 1;
            } while (lVar24 != 0xed);
            lVar28 = lVar28 + 1;
            lVar23 = lVar23 + 0x768;
            pcVar22 = pcVar22 + 0x1da;
            local_c8 = local_c8 + 0x1da;
            if (lVar28 == 0x77) {
              operator_delete__(pvVar15);
              Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
              remove(fileName_1._M_dataplus._M_p);
              operator_delete__(pcVar21);
              operator_delete__(pcVar20);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fileName_1._M_dataplus._M_p != &fileName_1.field_2) {
                operator_delete(fileName_1._M_dataplus._M_p,
                                fileName_1.field_2._M_allocated_capacity + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
              std::ostream::put(-0x60);
              std::ostream::flush();
              return;
            }
          } while( true );
        }
      } while( true );
    }
  }
  iVar9 = Imf_3_4::TiledRgbaInputFile::numXTiles(iVar11);
  Imf_3_4::TiledRgbaInputFile::readTiles(iVar11,0,iVar9 + -1,0,0);
  __assert_fail("tilesMissing || tilesBroken",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                ,0x275,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
}

Assistant:

void
testTiledRgba (const std::string& tempDir)
{
    try
    {
        cout << "Testing the tiled RGBA image interface" << endl;

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            const int W[] = {9, 69, 75, 80};
            const int H[] = {7, 50, 52, 55};

            for (int i = 0; i < 4; ++i)
            {
                cout << "\nImage size = " << W[i] << " x " << H[i] << endl;

                for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
                {
                    //
                    // for tiled files, ZIPS and ZIP are the same thing
                    //

                    if (comp == ZIP_COMPRESSION) comp++;

                    if (i == 0)
                    {
                        //
                        // for single-pixel tiles, we don't gain anything
                        // by testing multiple image sizes (and singe-pixel
                        // tiles are rather slow anyway)
                        //

                        writeRead (
                            tempDir, W[i], H[i], Compression (comp), 1, 1);
                    }

                    writeRead (tempDir, W[i], H[i], Compression (comp), 35, 26);
                    writeRead (tempDir, W[i], H[i], Compression (comp), 75, 52);
                    writeRead (
                        tempDir, W[i], H[i], Compression (comp), 264, 129);
                }
            }

            writeReadIncomplete (tempDir);
        }

        writeReadLayers (tempDir);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}